

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>::
ReadNumArgs(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>
            *this,int min_args)

{
  int iVar1;
  int in_ESI;
  BinaryReaderBase *in_stack_00000008;
  CStringRef in_stack_00000010;
  int num_args;
  BasicCStringRef<char> local_18;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                    ((BinaryReader<mp::internal::EndiannessConverter> *)
                     CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (iVar1 < in_ESI) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"too few arguments");
    BinaryReaderBase::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  return iVar1;
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }